

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
kj::_::
CopyConstructArray_<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false,_false>
::apply(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pos,
       basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *start,
       basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *end)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ExceptionGuard local_20;
  
  local_20.start = pos;
  local_20.pos = pos;
  if (start != end) {
    do {
      ((local_20.pos)->_M_dataplus)._M_p = (pointer)&(local_20.pos)->field_2;
      pcVar1 = (start->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_20.pos,pcVar1,pcVar1 + start->_M_string_length);
      start = start + 1;
      local_20.pos = local_20.pos + 1;
    } while (start != end);
  }
  pbVar2 = local_20.pos;
  local_20.start = local_20.pos;
  ExceptionGuard::~ExceptionGuard(&local_20);
  return pbVar2;
}

Assistant:

inline explicit ExceptionGuard(T* pos): start(pos), pos(pos) {}